

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBScpp.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  int iVar2;
  ostream *poVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  ulong uVar5;
  long lVar6;
  string *psVar7;
  pthread_t *ppVar8;
  size_t i_3;
  size_t i_4;
  size_t j;
  pthread_t *__newthread;
  size_t i_2;
  size_t i;
  ulong uVar9;
  string local_160;
  string local_140;
  vector<chromosome_inf,_std::allocator<chromosome_inf>_> local_120;
  undefined1 local_108 [8];
  vector<chromosome_inf,_std::allocator<chromosome_inf>_> chr_inf;
  vector<window_info,_std::allocator<window_info>_> tasks;
  vector<void_*,_std::allocator<void_*>_> thread_res;
  undefined1 local_b8 [8];
  string kmer_db_path;
  uint local_78;
  uint local_74;
  uint64_t local_70;
  undefined1 local_68 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> job_count;
  vector<unsigned_long,_std::allocator<unsigned_long>_> job_offset;
  
  deal_args((args_st *)local_b8,argc,argv);
  poVar3 = std::operator<<((ostream *)&std::cerr,"kmer_db_path: ");
  poVar3 = std::operator<<(poVar3,(string *)local_b8);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cerr,"reference_file_path: ");
  poVar3 = std::operator<<(poVar3,(string *)(kmer_db_path.field_2._M_local_buf + 8));
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cerr,"threads: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cerr,"kmer_size: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cerr,"window_size: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string
            ((string *)&local_160,(string *)(kmer_db_path.field_2._M_local_buf + 8));
  get_reference_inf((vector<chromosome_inf,_std::allocator<chromosome_inf>_> *)local_108,&local_160)
  ;
  std::__cxx11::string::~string((string *)&local_160);
  std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::vector
            (&local_120,(vector<chromosome_inf,_std::allocator<chromosome_inf>_> *)local_108);
  produce_tasks_via_refernce
            ((vector<window_info,_std::allocator<window_info>_> *)
             &chr_inf.super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_120,local_70,(ulong)local_74);
  std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::~vector(&local_120);
  std::__cxx11::string::string((string *)&local_140,(string *)local_b8);
  pvVar4 = read_kmer_db_vector(&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  uVar5 = ((long)tasks.super__Vector_base<window_info,_std::allocator<window_info>_>._M_impl.
                 super__Vector_impl_data._M_start -
          (long)chr_inf.super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) / 0x30;
  poVar3 = std::operator<<((ostream *)&std::cerr,"we total have ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," tasks ");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cerr,"calc tasknum");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,(ulong)local_78,
             (allocator_type *)
             &job_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  uVar9 = 0;
  while( true ) {
    lVar6 = (long)job_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start - (long)local_68 >> 3;
    uVar1 = lVar6 - 1;
    if (uVar1 <= uVar9) break;
    *(long *)((long)local_68 + uVar9 * 8) = (long)(int)(uVar5 / local_78);
    poVar3 = std::operator<<((ostream *)&std::cerr,"\t");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    uVar9 = uVar9 + 1;
  }
  *(ulong *)((long)local_68 + (lVar6 + -1) * 8) = uVar5 - uVar1 * *(unsigned_long *)local_68;
  poVar3 = std::operator<<((ostream *)&std::cerr,"\t");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cerr,"calc offset");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &job_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ulong)local_78,
             (allocator_type *)
             &tasks.super__Vector_base<window_info,_std::allocator<window_info>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  *job_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_end_of_storage = 0;
  poVar3 = std::operator<<((ostream *)&std::cerr,"\t");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  for (uVar5 = 1;
      uVar5 < (ulong)((long)job_offset.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start -
                      (long)job_count.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage >> 3);
      uVar5 = uVar5 + 1) {
    job_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[uVar5] =
         *(pointer)((long)local_68 + (uVar5 - 1) * 8) +
         job_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage[uVar5 - 1];
    poVar3 = std::operator<<((ostream *)&std::cerr,"\t");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cerr,"create threads");
  std::endl<char,std::char_traits<char>>(poVar3);
  psVar7 = (string *)calloc((ulong)local_78,0x48);
  ppVar8 = (pthread_t *)calloc((ulong)local_78,8);
  __newthread = ppVar8;
  for (uVar5 = 0; uVar5 < local_78; uVar5 = uVar5 + 1) {
    *(unsigned_long *)(psVar7 + 0x28) = *(pointer)((long)local_68 + uVar5 * 8);
    std::__cxx11::string::_M_assign(psVar7);
    *(unsigned_long *)(psVar7 + 0x20) =
         job_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage[uVar5];
    *(undefined1 **)(psVar7 + 0x38) = local_108;
    *(pointer **)(psVar7 + 0x30) =
         &chr_inf.super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)(psVar7 + 0x40) = pvVar4;
    iVar2 = pthread_create(__newthread,(pthread_attr_t *)0x0,thread_func,psVar7);
    if (iVar2 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"pthread_create error: error_code=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    psVar7 = psVar7 + 0x48;
    __newthread = __newthread + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"waiting threads");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &tasks.super__Vector_base<window_info,_std::allocator<window_info>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ulong)local_78,
             (allocator_type *)
             ((long)&job_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  lVar6 = 0;
  for (uVar5 = 0; uVar5 < local_78; uVar5 = uVar5 + 1) {
    iVar2 = pthread_join(*(pthread_t *)((long)ppVar8 + lVar6),
                         (void **)((long)&((tasks.
                                            super__Vector_base<window_info,_std::allocator<window_info>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          chromosome)._M_dataplus._M_p + lVar6));
    if (iVar2 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"pthread_join error: error_code=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    lVar6 = lVar6 + 8;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "seqname\tstart\tend\ttotal_kmers\tobserved_kmers\tvariations\tkmer_distance"
                          );
  std::endl<char,std::char_traits<char>>(poVar3);
  for (uVar5 = 0; uVar5 < local_78; uVar5 = uVar5 + 1) {
    psVar7 = (string *)
             (&((tasks.super__Vector_base<window_info,_std::allocator<window_info>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage)->chromosome)._M_dataplus)[uVar5]._M_p;
    for (uVar9 = 0; uVar9 < *(ulong *)((long)local_68 + uVar5 * 8); uVar9 = uVar9 + 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,psVar7);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar3);
      psVar7 = psVar7 + 0x50;
    }
  }
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            ((_Vector_base<void_*,_std::allocator<void_*>_> *)
             &tasks.super__Vector_base<window_info,_std::allocator<window_info>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
             &job_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
  std::vector<window_info,_std::allocator<window_info>_>::~vector
            ((vector<window_info,_std::allocator<window_info>_> *)
             &chr_inf.super__Vector_base<chromosome_inf,_std::allocator<chromosome_inf>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<chromosome_inf,_std::allocator<chromosome_inf>_>::~vector
            ((vector<chromosome_inf,_std::allocator<chromosome_inf>_> *)local_108);
  args_st::~args_st((args_st *)local_b8);
  return 0;
}

Assistant:

int main(int argc, char* argv[]){
    //load and check parameters
    auto [kmer_db_path, reference_file_path , threads , kmer_size, window_size] = deal_args(argc,argv);

    //log
    cerr << "kmer_db_path: " << kmer_db_path << endl;
    cerr << "reference_file_path: " << reference_file_path << endl;
    cerr << "threads: " << threads << endl;
    cerr << "kmer_size: " << kmer_size << endl;
    cerr << "window_size: " << window_size << endl;

    //deal reference file
    vector<chromosome_inf> chr_inf =  get_reference_inf(reference_file_path);


    //get tasks list
    vector<window_info> tasks =  produce_tasks_via_refernce(chr_inf,window_size,kmer_size);


    //get reference map,this is an alternative.
    //No significant speed improvement, increased memory usage.so discard
    // map<string, string> * ref = get_reference_map(reference_file_path);


    //read kmers database
    //method 1, slow in loading process,more mem usage.
    // KmerUint64Hash1* kmers =  read_kmer_db_hash(  kmer_db_path);  
    //method 2, slow in loading process
    // KmersSet * kmers = load_kmer_raw_file2(kmer_db_path, 10000, false);
    //method 3, low mem usage,more faster 
    vector<uint64_t> *kmers = read_kmer_db_vector(  kmer_db_path);   

    //Assigning Tasks
    uint64_t tasks_num = tasks.size();
    cerr << "we total have " <<  tasks_num<< " tasks "<<endl;

    //calc tasknum for each thread
    cerr<<"calc tasknum"<<endl;
    vector<uint64_t> job_count(threads);
    for(size_t i=0;i<job_count.size()-1;i++){
        job_count[i]=(int)(tasks_num/threads);
        cerr << "\t" << job_count[i]; //
    }
    job_count[job_count.size()-1] = tasks_num-(job_count[0]*(job_count.size()-1));
    cerr << "\t" << job_count[job_count.size()-1] << "\n";// 

    

    //calc task offset for each thread
    cerr<<"calc offset"<<endl;
    vector<uint64_t> job_offset(threads);
    job_offset[0]=0;
    cerr << "\t" << job_offset[0] ; //
    for(size_t i=1;i<job_offset.size();i++){
        job_offset[i]=job_offset[i-1] + job_count[i-1];
        cerr << "\t" << job_offset[i]; //
    }
    cerr <<"\n"<<endl;

    // create the threads 
    cerr<<"create threads"<<endl;
    struct thread_data * td = (struct thread_data *)calloc(threads,sizeof(thread_data));
    pthread_t * tids=(pthread_t *)calloc(threads,sizeof(pthread_t));
    for(size_t i = 0; i < threads; ++i)
    {
        (td+i)->jobcount = job_count[i];
        (td+i)->reference =reference_file_path ;
        (td+i)->joboffset = job_offset[i];
        // vector<chromosome_inf> &tmp_chr_inf = chr_inf;
        (td+i)->chr_inf = &chr_inf;
        // vector<window_info> &tmp_tasks = tasks;
        (td+i)->tasks = &tasks;
        (td+i)->kmers = kmers;
        // (td+i)->ref = ref;
        //参数依次是：创建的线程id，线程参数，调用的函数，传入的函数参数
        int ret = pthread_create(tids+i, NULL, thread_func,(void *)(td+i));
        if (ret != 0)
        {
            cerr << "pthread_create error: error_code=" << ret << endl;
        }
    }


    //thread join
    cerr<<"waiting threads"<<endl;
    vector<void *> thread_res(threads);
    for(size_t i = 0; i < threads; ++i)
    {
        int ret = pthread_join ( *(tids+i), &thread_res[i] );
        if (ret != 0)
        {
            cerr << "pthread_join error: error_code=" << ret << endl;
        }

    }
    
    cout << "seqname\tstart\tend\ttotal_kmers\tobserved_kmers\tvariations\tkmer_distance" << endl;

    for(size_t i = 0; i < threads; ++i)
    {
        struct result * tmp_res = (struct result *)thread_res[i];
        for (size_t j=0;j < job_count[i];j++){
            cout << (tmp_res+j)->seqname << "\t";
            cout << (tmp_res+j)->start << "\t";
            cout << (tmp_res+j)->end << "\t";
            cout << (tmp_res+j)->total_kmers << "\t";
            cout << (tmp_res+j)->observed_kmers << "\t";
            cout << (tmp_res+j)->variations << "\t";
            cout << (tmp_res+j)->kmer_distance << endl;
        }

    }

    return 0;
}